

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intContain.c
# Opt level: O2

Aig_Man_t * Inter_ManFramesLatches(Aig_Man_t *pAig,int nFrames,Vec_Ptr_t **pvMapReg)

{
  int iVar1;
  Aig_Man_t *p;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  void *pvVar7;
  int iVar8;
  int iVar9;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intContain.c"
                  ,0x74,"Aig_Man_t *Inter_ManFramesLatches(Aig_Man_t *, int, Vec_Ptr_t **)");
  }
  p = Aig_ManStart((pAig->nObjs[6] + pAig->nObjs[5]) * nFrames);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  iVar1 = pAig->nRegs;
  iVar9 = (nFrames + 1) * iVar1;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  iVar8 = 8;
  if (6 < iVar9 - 1U) {
    iVar8 = iVar9;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar8;
  iVar9 = 0;
  if (iVar8 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar2->pArray = ppvVar3;
  *pvMapReg = pVVar2;
  for (; iVar9 < iVar1; iVar9 = iVar9 + 1) {
    pvVar4 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar9);
    pAVar5 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
    Vec_PtrPush(*pvMapReg,pAVar5);
    iVar1 = pAig->nRegs;
  }
  iVar1 = 0;
  if (nFrames < 1) {
    nFrames = 0;
  }
  for (; iVar1 != nFrames; iVar1 = iVar1 + 1) {
    for (iVar8 = 0; iVar8 < pAig->nTruePis; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCis,iVar8);
      pAVar5 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar4 + 0x28) = pAVar5;
    }
    for (iVar8 = 0; iVar8 < pAig->vObjs->nSize; iVar8 = iVar8 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vObjs,iVar8);
      if ((pAVar5 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar5->field_0x18 & 7) - 7)) {
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        p1 = Aig_ObjChild1Copy(pAVar5);
        pAVar6 = Aig_And(p,pAVar6,p1);
        (pAVar5->field_5).pData = pAVar6;
      }
    }
    for (iVar8 = 0; iVar9 = pAig->nRegs, iVar8 < iVar9; iVar8 = iVar8 + 1) {
      pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar8);
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      (pAVar5->field_5).pData = pAVar6;
    }
    for (iVar8 = 0; iVar8 < iVar9; iVar8 = iVar8 + 1) {
      pvVar4 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar8);
      pvVar7 = Vec_PtrEntry(pAig->vCis,pAig->nTruePis + iVar8);
      pvVar4 = *(void **)((long)pvVar4 + 0x28);
      *(void **)((long)pvVar7 + 0x28) = pvVar4;
      Vec_PtrPush(*pvMapReg,pvVar4);
      iVar9 = pAig->nRegs;
    }
  }
  return p;
}

Assistant:

Aig_Man_t * Inter_ManFramesLatches( Aig_Man_t * pAig, int nFrames, Vec_Ptr_t ** pvMapReg )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    *pvMapReg = Vec_PtrAlloc( (nFrames+1) * Saig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pFrames );
        Vec_PtrPush( *pvMapReg, pObj->pData );
    }
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
        {
            pObjLo->pData = pObjLi->pData;
            Vec_PtrPush( *pvMapReg, pObjLo->pData );
        }
    }
    return pFrames;
}